

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O2

Expr * __thiscall SQCompilation::SQParser::BitwiseXorExp(SQParser *this)

{
  Expr *pEVar1;
  NestingChecker nc;
  
  NestingChecker::NestingChecker(&nc,this);
  pEVar1 = BitwiseAndExp(this);
  while( true ) {
    NestingChecker::inc(&nc);
    if (this->_token != 0x5e) break;
    pEVar1 = BIN_EXP<SQCompilation::Expr*(SQCompilation::SQParser::*)()>
                       (this,0x1548de,TO_BLOCK,(Expr *)0x18);
  }
  (nc._p)->_depth = (nc._p)->_depth - nc._depth;
  return pEVar1;
}

Assistant:

Expr* SQParser::BitwiseXorExp()
{
    NestingChecker nc(this);
    Expr * lhs = BitwiseAndExp();
    for (;;) {
        nc.inc();
        if (_token == _SC('^')) {
            lhs = BIN_EXP(&SQParser::BitwiseAndExp, TO_XOR, lhs);
        }
        else return lhs;
    }
}